

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

uint pugi::impl::anon_unknown_0::get_value_uint(char_t *value,uint def)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  int __base;
  
  pbVar2 = (byte *)value;
  if (value != (char_t *)0x0) {
    do {
      pbVar3 = pbVar2;
      bVar1 = *pbVar3;
      pbVar2 = pbVar3 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    __base = 10;
    if (pbVar3[bVar1 == 0x2d] == 0x30) {
      bVar1 = (pbVar3 + 1)[bVar1 == 0x2d];
      __base = 0x10;
      if (bVar1 != 0x78) {
        __base = 10;
        if (bVar1 == 0x58) {
          __base = 0x10;
        }
      }
    }
    uVar4 = strtoul(value,(char **)0x0,__base);
    def = (uint)uVar4;
  }
  return def;
}

Assistant:

PUGI__FN unsigned int get_value_uint(const char_t* value, unsigned int def)
	{
		if (!value) return def;

		int base = get_integer_base(value);

	#ifdef PUGIXML_WCHAR_MODE
		return static_cast<unsigned int>(wcstoul(value, 0, base));
	#else
		return static_cast<unsigned int>(strtoul(value, 0, base));
	#endif
	}